

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackArchiveGenerator.cxx
# Opt level: O1

string * __thiscall
cmCPackArchiveGenerator::GetArchiveComponentFileName
          (string *__return_storage_ptr__,cmCPackArchiveGenerator *this,string *component,
          bool isGroupName)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long *plVar3;
  char *pcVar4;
  size_type *psVar5;
  string componentUpper;
  allocator local_b9;
  string local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  string local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  string local_50;
  
  cmsys::SystemTools::UpperCase(&local_50,component);
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  std::operator+(&local_98,"CPACK_ARCHIVE_",&local_50);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
  paVar1 = &local_b8.field_2;
  psVar5 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar5) {
    local_b8.field_2._M_allocated_capacity = *psVar5;
    local_b8.field_2._8_8_ = plVar3[3];
    local_b8._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar5;
    local_b8._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_b8._M_string_length = plVar3[1];
  *plVar3 = (long)psVar5;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if (bVar2) {
    std::operator+(&local_98,"CPACK_ARCHIVE_",&local_50);
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_98);
    psVar5 = (size_type *)(plVar3 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar3 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar5) {
      local_b8.field_2._M_allocated_capacity = *psVar5;
      local_b8.field_2._8_8_ = plVar3[3];
      local_b8._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_b8.field_2._M_allocated_capacity = *psVar5;
      local_b8._M_dataplus._M_p = (pointer)*plVar3;
    }
    local_b8._M_string_length = plVar3[1];
    *plVar3 = (long)psVar5;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_b8);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_78.field_2._M_allocated_capacity = local_98.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) goto LAB_002a505c;
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"CPACK_ARCHIVE_FILE_NAME","");
    bVar2 = cmCPackGenerator::IsSet(&this->super_cmCPackGenerator,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if (bVar2) {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"CPACK_ARCHIVE_FILE_NAME","");
      pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_78);
      std::__cxx11::string::string((string *)&local_98,pcVar4,&local_b9);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (&local_b8,this,&local_98,component,(ulong)isGroupName);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
    }
    else {
      local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_78,"CPACK_PACKAGE_FILE_NAME","");
      pcVar4 = cmCPackGenerator::GetOption(&this->super_cmCPackGenerator,&local_78);
      std::__cxx11::string::string((string *)&local_98,pcVar4,&local_b9);
      (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[8])
                (&local_b8,this,&local_98,component,(ulong)isGroupName);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    local_98._M_dataplus._M_p = local_78._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p == &local_78.field_2) goto LAB_002a505c;
  }
  operator_delete(local_98._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
LAB_002a505c:
  (*(this->super_cmCPackGenerator)._vptr_cmCPackGenerator[4])(this);
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackArchiveGenerator::GetArchiveComponentFileName(
  const std::string& component, bool isGroupName)
{
  std::string componentUpper(cmSystemTools::UpperCase(component));
  std::string packageFileName;

  if (this->IsSet("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME")) {
    packageFileName +=
      this->GetOption("CPACK_ARCHIVE_" + componentUpper + "_FILE_NAME");
  } else if (this->IsSet("CPACK_ARCHIVE_FILE_NAME")) {
    packageFileName += GetComponentPackageFileName(
      this->GetOption("CPACK_ARCHIVE_FILE_NAME"), component, isGroupName);
  } else {
    packageFileName += GetComponentPackageFileName(
      this->GetOption("CPACK_PACKAGE_FILE_NAME"), component, isGroupName);
  }

  packageFileName += this->GetOutputExtension();

  return packageFileName;
}